

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O3

int __thiscall tf::TFProfObserver::on_exit(TFProfObserver *this,__func *__func,void *__arg)

{
  long lVar1;
  pointer pvVar2;
  _Map_pointer pptVar3;
  _Map_pointer pptVar4;
  _Elt_pointer ptVar5;
  _Elt_pointer ptVar6;
  _Elt_pointer ptVar7;
  _Elt_pointer ptVar8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *ptVar9;
  reference pvVar10;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *ptVar11;
  size_type __new_size;
  pointer psVar12;
  value_type beg;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  TaskType local_2c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  
  lVar1 = *(long *)(__func + 8);
  pvVar2 = (this->_timeline).segments.
           super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar12 = (this->_stacks).
            super__Vector_base<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_std::allocator<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pptVar3 = *(_Map_pointer *)
             ((long)&psVar12[lVar1].c.
                     super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                     ._M_impl + 0x48);
  ptVar9 = ((iterator *)
           ((long)&psVar12[lVar1].c.
                   super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                   ._M_impl + 0x30))->_M_cur;
  ptVar11 = *(_Elt_pointer *)
             ((long)&psVar12[lVar1].c.
                     super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                     ._M_impl + 0x38);
  __new_size = ((long)*(_Elt_pointer *)
                       ((long)&psVar12[lVar1].c.
                               super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                               ._M_impl + 0x20) -
                (long)((iterator *)
                      ((long)&psVar12[lVar1].c.
                              super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                              ._M_impl + 0x10))->_M_cur >> 3) + ((long)ptVar9 - (long)ptVar11 >> 3)
               + ((((ulong)((long)pptVar3 -
                           (long)*(_Map_pointer *)
                                  ((long)&psVar12[lVar1].c.
                                          super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                                          ._M_impl + 0x28)) >> 3) - 1) +
                 (ulong)(pptVar3 == (_Map_pointer)0x0)) * 0x40;
  if ((ulong)(((long)*(pointer *)
                      ((long)&pvVar2[lVar1].
                              super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar2[lVar1].
                         super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                         ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555) < __new_size)
  {
    std::
    vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
    ::resize(pvVar2 + lVar1,__new_size);
    psVar12 = (this->_stacks).
              super__Vector_base<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_std::allocator<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ptVar9 = ((iterator *)
             ((long)&psVar12[lVar1].c.
                     super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                     ._M_impl + 0x30))->_M_cur;
    ptVar11 = *(_Elt_pointer *)
               ((long)&psVar12[lVar1].c.
                       super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                       ._M_impl + 0x38);
  }
  if (ptVar9 == ptVar11) {
    ptVar9 = psVar12[lVar1].c.
             super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_38.__d.__r = (duration)ptVar9[-1].__d.__r;
  std::
  deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ::pop_back(&psVar12[lVar1].c);
  psVar12 = (this->_stacks).
            super__Vector_base<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_std::allocator<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pptVar3 = *(_Map_pointer *)
             ((long)&psVar12[lVar1].c.
                     super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                     ._M_impl + 0x48);
  pptVar4 = *(_Map_pointer *)
             ((long)&psVar12[lVar1].c.
                     super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                     ._M_impl + 0x28);
  ptVar5 = ((iterator *)
           ((long)&psVar12[lVar1].c.
                   super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                   ._M_impl + 0x30))->_M_cur;
  ptVar6 = *(_Elt_pointer *)
            ((long)&psVar12[lVar1].c.
                    super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                    ._M_impl + 0x38);
  ptVar7 = ((iterator *)
           ((long)&psVar12[lVar1].c.
                   super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                   ._M_impl + 0x10))->_M_cur;
  ptVar8 = *(_Elt_pointer *)
            ((long)&psVar12[lVar1].c.
                    super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                    ._M_impl + 0x20);
  lVar1 = *(long *)&(this->_timeline).segments.
                    super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar1].
                    super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                    ._M_impl.super__Vector_impl_data;
  local_2c = UNDEFINED;
  if ((ulong)*(byte *)((long)__arg + 0xc0) < 9) {
    local_2c = *(TaskType *)(&DAT_001117dc + (ulong)*(byte *)((long)__arg + 0xc0) * 4);
  }
  local_28.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  pvVar10 = std::vector<tf::Segment,std::allocator<tf::Segment>>::
            emplace_back<std::__cxx11::string_const&,tf::TaskType,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                      ((vector<tf::Segment,std::allocator<tf::Segment>> *)
                       (lVar1 + ((((ulong)((long)pptVar3 - (long)pptVar4) >> 3) - 1) +
                                (ulong)(pptVar3 == (_Map_pointer)0x0)) * 0x600 +
                        ((ulong)((long)ptVar5 - (long)ptVar6) >> 3) * 0x18 +
                       ((ulong)((long)ptVar8 - (long)ptVar7) >> 3) * 0x18),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)__arg + 8),&local_2c,&local_38,&local_28);
  return (int)pvVar10;
}

Assistant:

inline void TFProfObserver::on_exit(WorkerView wv, TaskView tv) {

  size_t w = wv.id();

  assert(!_stacks[w].empty());
  
  if(_stacks[w].size() > _timeline.segments[w].size()) {
    _timeline.segments[w].resize(_stacks[w].size());
  }

  auto beg = _stacks[w].top();
  _stacks[w].pop();

  _timeline.segments[w][_stacks[w].size()].emplace_back(
    tv.name(), tv.type(), beg, observer_stamp_t::clock::now()
  );
}